

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::AppendableFile,_std::nullptr_t> __thiscall kj::newDiskAppendableFile(kj *this,OwnFd *fd)

{
  AppendableFile *extraout_RDX;
  Own<kj::AppendableFile,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskAppendableFile,_std::nullptr_t> local_28;
  
  heap<kj::(anonymous_namespace)::DiskAppendableFile,kj::OwnFd>((kj *)&local_28,fd);
  *(Disposer **)this = local_28.disposer;
  *(DiskAppendableFile **)(this + 8) = local_28.ptr;
  local_28.ptr = (DiskAppendableFile *)0x0;
  Own<kj::(anonymous_namespace)::DiskAppendableFile,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<AppendableFile> newDiskAppendableFile(kj::OwnFd fd) {
  return heap<DiskAppendableFile>(kj::mv(fd));
}